

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  float in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  float in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_d8;
  float fStack_d4;
  ImVec2 local_b0;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 unsaved_marker_pos;
  ImVec2 local_50;
  ImVec2 IStack_48;
  ImVec2 local_40;
  ImVec2 IStack_38;
  
  pIVar4 = GImGui;
  bVar5 = false;
  frame_padding_local = frame_padding;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar8 = (bb->Min).x;
  fVar7 = (bb->Max).x;
  if (1.0 < fVar7 - fVar8) {
    local_d8 = frame_padding.x;
    fStack_d4 = frame_padding.y;
    fVar8 = fVar8 + local_d8;
    fVar9 = (bb->Min).y + fStack_d4;
    fVar7 = fVar7 - local_d8;
    fVar1 = (bb->Max).y;
    if ((flags & 1U) != 0) {
      local_78 = fStack_d4;
      fStack_74 = fStack_d4;
      fStack_70 = fStack_d4;
      fStack_6c = fStack_d4;
      local_88._8_4_ = extraout_XMM0_Dc;
      local_88._0_4_ = label_size.x;
      local_88._4_4_ = label_size.y;
      local_88._12_4_ = extraout_XMM0_Dd;
      local_68 = fVar8;
      fStack_64 = fVar9;
      fStack_60 = in_XMM0_Dc + 0.0;
      fStack_5c = in_XMM0_Dd + 0.0;
      IVar3 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar7 = fVar7 - IVar3.x;
      unsaved_marker_pos.x = (bb->Min).x + local_d8 + (float)local_88._0_4_ + 2.0;
      if (fVar7 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar7;
      }
      unsaved_marker_pos.y = (float)(int)(pIVar4->FontSize * -0.25) + local_78 + (bb->Min).y;
      local_98.y = (bb->Max).y - fStack_d4;
      local_98.x = (bb->Max).x - local_d8;
      local_b0.x = 0.0;
      local_b0.y = 0.0;
      RenderTextClippedEx(draw_list,&unsaved_marker_pos,&local_98,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_b0,(ImRect *)0x0);
      fVar8 = local_68;
      fVar9 = fStack_64;
    }
    local_98.y = fVar9;
    local_98.x = fVar8;
    local_90.x = fVar7;
    local_90.y = fVar1;
    if ((close_button_id == 0) ||
       ((pIVar4->HoveredId != close_button_id && pIVar4->HoveredId != tab_id &&
        (pIVar4->ActiveId != close_button_id)))) {
      fVar8 = (bb->Max).x + -1.0;
      bVar5 = false;
    }
    else {
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup
                ((ImGuiItemHoveredDataBackup *)&unsaved_marker_pos);
      fVar8 = pIVar4->FontSize;
      PushStyleVar(10,&frame_padding_local);
      local_b0.y = (bb->Min).y;
      local_b0.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar8;
      bVar5 = CloseButton(close_button_id,&local_b0);
      PopStyleVar(1);
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = (ImGuiID)unsaved_marker_pos.x;
      (pIVar2->DC).LastItemStatusFlags = (ImGuiItemStatusFlags)unsaved_marker_pos.y;
      (pIVar2->DC).LastItemRect.Min = local_50;
      (pIVar2->DC).LastItemRect.Max = IStack_48;
      (pIVar2->DC).LastItemDisplayRect.Min = local_40;
      (pIVar2->DC).LastItemDisplayRect.Max = IStack_38;
      if ((flags & 4U) == 0) {
        bVar6 = IsMouseClicked(2,false);
        bVar5 = bVar5 || bVar6;
      }
      fVar8 = fVar7 - fVar8;
      fVar7 = fVar8;
    }
    RenderTextEllipsis(draw_list,&local_98,&local_90,fVar7,fVar8,label,(char *)0x0,&label_size);
  }
  return bVar5;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

    return close_button_pressed;
}